

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::MarkSuccessors
          (Prog *this,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  pointer *ppvVar1;
  vector<int,std::allocator<int>> *this_00;
  int iVar2;
  Deleter DVar3;
  uint uVar4;
  IndexValue *pIVar5;
  int *piVar6;
  Inst *pIVar7;
  pointer pvVar8;
  _Head_base<1UL,_re2::PODArray<int>::Deleter,_false> _Var9;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  iterator iVar14;
  int *piVar15;
  iterator __position;
  int id;
  uint local_5c;
  SparseArray<int> *local_58;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_50;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_4c;
  Prog *local_48;
  SparseSet *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  pIVar5 = (rootmap->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  _Var10._M_head_impl.len_ =
       (rootmap->dense_).ptr_._M_t.
       super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
       ._M_t.
       super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
       .super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>.
       super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>.
       _M_head_impl;
  if (_Var10._M_head_impl.len_ != 0 && pIVar5 != (IndexValue *)0x0) {
    iVar2 = rootmap->size_;
    piVar15 = (rootmap->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
              _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
    *piVar15 = iVar2;
    pIVar5[iVar2].index_ = 0;
    rootmap->size_ = iVar2 + 1;
    pIVar5[*piVar15].value_ = iVar2;
    _Var10._M_head_impl.len_ =
         (rootmap->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>.
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>.
         _M_head_impl;
  }
  DVar3.len_ = this->start_unanchored_;
  if ((uint)DVar3.len_ < (uint)_Var10._M_head_impl.len_ && pIVar5 != (IndexValue *)0x0) {
    piVar15 = (rootmap->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
              _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
    uVar11 = rootmap->size_;
    if ((uVar11 <= (uint)piVar15[DVar3.len_]) || (pIVar5[piVar15[DVar3.len_]].index_ != DVar3.len_))
    {
      piVar15[DVar3.len_] = uVar11;
      pIVar5[(int)uVar11].index_ = DVar3.len_;
      rootmap->size_ = uVar11 + 1;
      pIVar5[piVar15[DVar3.len_]].value_ = uVar11;
      _Var10._M_head_impl.len_ =
           (rootmap->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>.
           super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>.
           _M_head_impl;
    }
  }
  if ((pIVar5 != (IndexValue *)0x0) &&
     (DVar3.len_ = this->start_, (uint)DVar3.len_ < (uint)_Var10._M_head_impl.len_)) {
    piVar15 = (rootmap->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
              _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
    uVar11 = rootmap->size_;
    if ((uVar11 <= (uint)piVar15[DVar3.len_]) || (pIVar5[piVar15[DVar3.len_]].index_ != DVar3.len_))
    {
      piVar15[DVar3.len_] = uVar11;
      pIVar5[(int)uVar11].index_ = DVar3.len_;
      rootmap->size_ = uVar11 + 1;
      pIVar5[piVar15[DVar3.len_]].value_ = uVar11;
    }
  }
  reachable->size_ = 0;
  piVar15 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  iVar14._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar14._M_current != piVar15) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar15;
    iVar14._M_current = piVar15;
  }
  local_50 = (anon_union_4_5_a3ff96c3_for_Inst_2)this->start_unanchored_;
  local_58 = rootmap;
  local_48 = this;
  if (iVar14._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar14,&local_50.cap_);
    piVar15 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  else {
    *iVar14._M_current = (int)local_50;
    piVar15 = iVar14._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar15;
  }
  local_40 = reachable;
  local_38 = stk;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      == piVar15) {
    return;
  }
LAB_001c3233:
  local_5c = piVar15[-1];
  uVar12 = (ulong)local_5c;
  (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       piVar15 + -1;
  do {
    _Var9._M_head_impl.len_ = SUB84(uVar12,0);
    piVar15 = (reachable->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
              _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if ((piVar15 != (int *)0x0) &&
       ((uint)_Var9._M_head_impl.len_ <
        (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>)) {
      piVar6 = (reachable->sparse_).ptr_._M_t.
               super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      uVar11 = piVar6[(int)_Var9._M_head_impl.len_];
      uVar4 = reachable->size_;
      if ((uVar11 < uVar4) && ((Deleter)piVar15[(int)uVar11] == _Var9._M_head_impl.len_)) break;
      piVar6[(int)_Var9._M_head_impl.len_] = uVar4;
      ((Deleter *)(piVar15 + (int)uVar4))->len_ = (int)_Var9._M_head_impl.len_;
      reachable->size_ = reachable->size_ + 1;
      _Var9._M_head_impl.len_ = (Deleter)(Deleter)local_5c;
    }
    pIVar7 = (local_48->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar11 = pIVar7[(int)_Var9._M_head_impl.len_].out_opcode_;
    switch(uVar11 & 7) {
    case 0:
    case 1:
      local_50.out1_ = uVar11 >> 4;
      local_4c = pIVar7[(int)_Var9._M_head_impl.len_].field_1;
      lVar13 = 0;
      do {
        _Var10._M_head_impl.len_ = (Deleter)((Deleter *)((long)&local_50 + lVar13))->len_;
        pIVar5 = (predmap->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
        if ((pIVar5 == (IndexValue *)0x0) ||
           ((uint)*(int *)&(predmap->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
            <= (uint)_Var10._M_head_impl.len_)) {
          __position._M_current =
               (predvec->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
LAB_001c336f:
          if (__position._M_current ==
              (predvec->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::_M_realloc_insert<>(predvec,__position);
          }
          else {
            ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ppvVar1 = &(predvec->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
        }
        else {
          piVar15 = (predmap->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar11 = predmap->size_;
          if ((uVar11 <= (uint)piVar15[(int)_Var10._M_head_impl.len_]) ||
             ((Deleter)pIVar5[piVar15[(int)_Var10._M_head_impl.len_]].index_ !=
              _Var10._M_head_impl.len_)) {
            __position._M_current =
                 (predvec->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            pvVar8 = (predvec->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar15[(int)_Var10._M_head_impl.len_] = uVar11;
            pIVar5[(int)uVar11].index_ = (int)_Var10._M_head_impl.len_;
            predmap->size_ = uVar11 + 1;
            pIVar5[piVar15[(int)_Var10._M_head_impl.len_]].value_ =
                 (int)((ulong)((long)__position._M_current - (long)pvVar8) >> 3) * -0x55555555;
            goto LAB_001c336f;
          }
        }
        this_00 = (vector<int,std::allocator<int>> *)
                  ((predvec->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start +
                  (predmap->dense_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                  .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
                  [(predmap->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var10._M_head_impl.len_]].
                  value_);
        iVar14._M_current = *(int **)(this_00 + 8);
        if (iVar14._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    (this_00,iVar14,(int *)&local_5c);
        }
        else {
          *iVar14._M_current = local_5c;
          *(int **)(this_00 + 8) = iVar14._M_current + 1;
        }
        stk = local_38;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 8);
      local_50 = pIVar7[(int)_Var9._M_head_impl.len_].field_1;
      iVar14._M_current =
           (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar14._M_current ==
          (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_38,iVar14,&local_50.cap_);
        reachable = local_40;
      }
      else {
        *iVar14._M_current = (int)local_50;
        (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar14._M_current + 1;
        reachable = local_40;
      }
LAB_001c3418:
      uVar11 = pIVar7[(int)_Var9._M_head_impl.len_].out_opcode_;
    case 6:
      uVar12 = (ulong)(uVar11 >> 4);
LAB_001c3420:
      local_5c = (uint)uVar12;
      break;
    default:
      _Var10._M_head_impl.len_ = (Deleter)(uVar11 >> 4);
      uVar12 = (ulong)(uint)_Var10._M_head_impl.len_;
      pIVar5 = (local_58->dense_).ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
      if ((pIVar5 != (IndexValue *)0x0) &&
         ((uint)_Var10._M_head_impl.len_ <
          (uint)*(int *)&(local_58->dense_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                         .
                         super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                         .
                         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
         )) {
        piVar15 = (local_58->sparse_).ptr_._M_t.
                  super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
        uVar11 = local_58->size_;
        if ((uVar11 <= (uint)piVar15[uVar12]) ||
           ((Deleter)pIVar5[piVar15[uVar12]].index_ != _Var10._M_head_impl.len_)) {
          piVar15[uVar12] = uVar11;
          pIVar5[(int)uVar11].index_ = (int)_Var10._M_head_impl.len_;
          local_58->size_ = uVar11 + 1;
          pIVar5[piVar15[uVar12]].value_ = uVar11;
          goto LAB_001c3418;
        }
      }
      goto LAB_001c3420;
    case 5:
    case 7:
      goto switchD_001c32a2_caseD_5;
    }
  } while( true );
switchD_001c32a2_caseD_5:
  piVar15 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      == piVar15) {
    return;
  }
  goto LAB_001c3233;
}

Assistant:

void Prog::MarkSuccessors(SparseArray<int>* rootmap,
                          SparseArray<int>* predmap,
                          std::vector<std::vector<int>>* predvec,
                          SparseSet* reachable, std::vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  reachable->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        // Mark this instruction as a predecessor of each out.
        for (int out : {ip->out(), ip->out1()}) {
          if (!predmap->has_index(out)) {
            predmap->set_new(out, static_cast<int>(predvec->size()));
            predvec->emplace_back();
          }
          (*predvec)[predmap->get_existing(out)].emplace_back(id);
        }
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction as a "root".
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}